

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCopiesAndBlittingTests.cpp
# Opt level: O0

void vkt::api::anon_unknown_0::addResolveImageWholeCopyBeforeResolvingTests(TestCaseGroup *group)

{
  ResolveImageToImageTestCase *this;
  TestContext *testCtx;
  VkSampleCountFlagBits sampleFlag;
  undefined8 extraout_RDX;
  undefined8 uVar1;
  undefined8 extraout_RDX_00;
  TestParams local_1d8;
  string local_188;
  string local_168;
  undefined1 local_148 [8];
  string description;
  int samplesIndex;
  undefined1 auStack_118 [8];
  CopyRegion imageResolve;
  VkImageResolve testResolve;
  VkImageSubresourceLayers sourceLayer;
  undefined1 local_60 [8];
  TestParams params;
  TestCaseGroup *group_local;
  
  params._72_8_ = group;
  TestParams::TestParams((TestParams *)local_60);
  local_60._0_4_ = VK_IMAGE_TYPE_2D;
  local_60._4_4_ = VK_FORMAT_R8G8B8A8_UNORM;
  params.src.buffer.size = (Buffer)0x4000000040;
  params.src.image.extent.width = 1;
  params.src.image.extent.height = 6;
  params.src.image.extent.depth = 1;
  params.src.image.operationLayout = 0x25;
  params.dst.buffer.size = (Buffer)0x4000000040;
  params.dst.image.extent.width = 1;
  params.dst.image.extent.height = 7;
  testResolve.dstSubresource.layerCount = 0;
  testResolve.dstOffset.x = 0;
  testResolve.dstOffset.y = 0x40;
  testResolve.dstOffset.z = 0x40;
  testResolve.srcOffset.z = 0;
  testResolve.dstSubresource.aspectMask = 0;
  testResolve.dstSubresource.mipLevel = 1;
  testResolve.dstSubresource.baseArrayLayer = 0;
  testResolve.srcSubresource.baseArrayLayer = 0;
  testResolve.srcSubresource.layerCount = 0;
  testResolve.srcOffset.x = 0;
  testResolve.srcOffset.y = 1;
  imageResolve._72_8_ = 1;
  testResolve.srcSubresource.aspectMask = 0;
  testResolve.srcSubresource.mipLevel = 1;
  testResolve.extent.width = 1;
  imageResolve.imageCopy.extent.width = 1;
  imageResolve._40_8_ = 0;
  imageResolve._48_8_ = 0x4000000040;
  imageResolve._24_8_ = 0;
  imageResolve._32_8_ = 1;
  imageResolve.bufferCopy.dstOffset = 0;
  imageResolve.bufferCopy.size = 0x100000000;
  auStack_118 = (undefined1  [8])0x1;
  imageResolve.bufferCopy.srcOffset = 0x100000000;
  std::
  vector<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
  ::push_back((vector<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
               *)&params.dst.image.extent.depth,(value_type *)auStack_118);
  uVar1 = extraout_RDX;
  for (description.field_2._8_4_ = 0; (int)description.field_2._8_4_ < 6;
      description.field_2._8_4_ = description.field_2._8_4_ + 1) {
    params.regions.
    super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
         *(undefined4 *)
          (api::(anonymous_namespace)::samples + (long)(int)description.field_2._8_4_ * 4);
    api::(anonymous_namespace)::getSampleCountCaseName_abi_cxx11_
              (&local_168,
               (_anonymous_namespace_ *)
               (ulong)*(uint *)(api::(anonymous_namespace)::samples +
                               (long)(int)description.field_2._8_4_ * 4),
               (VkSampleCountFlagBits)uVar1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                   "With ",&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    uVar1 = params._72_8_;
    this = (ResolveImageToImageTestCase *)operator_new(200);
    testCtx = tcu::TestNode::getTestContext((TestNode *)params._72_8_);
    api::(anonymous_namespace)::getSampleCountCaseName_abi_cxx11_
              (&local_188,
               (_anonymous_namespace_ *)
               (ulong)*(uint *)(api::(anonymous_namespace)::samples +
                               (long)(int)description.field_2._8_4_ * 4),sampleFlag);
    TestParams::TestParams(&local_1d8,(TestParams *)local_60);
    ResolveImageToImageTestCase::ResolveImageToImageTestCase
              (this,testCtx,&local_188,(string *)local_148,&local_1d8,COPY_MS_IMAGE_TO_MS_IMAGE);
    tcu::TestNode::addChild((TestNode *)uVar1,(TestNode *)this);
    TestParams::~TestParams(&local_1d8);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)local_148);
    uVar1 = extraout_RDX_00;
  }
  TestParams::~TestParams((TestParams *)local_60);
  return;
}

Assistant:

void addResolveImageWholeCopyBeforeResolvingTests (tcu::TestCaseGroup* group)
{
	TestParams	params;
	params.src.image.imageType			= VK_IMAGE_TYPE_2D;
	params.src.image.format				= VK_FORMAT_R8G8B8A8_UNORM;
	params.src.image.extent				= defaultExtent;
	params.src.image.operationLayout	= VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL;
	params.dst.image.imageType			= VK_IMAGE_TYPE_2D;
	params.dst.image.format				= VK_FORMAT_R8G8B8A8_UNORM;
	params.dst.image.extent				= defaultExtent;
	params.dst.image.operationLayout	= VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL;

	{
		const VkImageSubresourceLayers	sourceLayer	=
		{
			VK_IMAGE_ASPECT_COLOR_BIT,	// VkImageAspectFlags	aspectMask;
			0u,							// uint32_t				mipLevel;
			0u,							// uint32_t				baseArrayLayer;
			1u							// uint32_t				layerCount;
		};

		const VkImageResolve			testResolve	=
		{
			sourceLayer,		// VkImageSubresourceLayers	srcSubresource;
			{0, 0, 0},			// VkOffset3D				srcOffset;
			sourceLayer,		// VkImageSubresourceLayers	dstSubresource;
			{0, 0, 0},			// VkOffset3D				dstOffset;
			defaultExtent,		// VkExtent3D				extent;
		};

		CopyRegion	imageResolve;
		imageResolve.imageResolve	= testResolve;
		params.regions.push_back(imageResolve);
	}

	for (int samplesIndex = 0; samplesIndex < DE_LENGTH_OF_ARRAY(samples); ++samplesIndex)
	{
		params.samples					= samples[samplesIndex];
		const std::string description	= "With " + getSampleCountCaseName(samples[samplesIndex]);
		group->addChild(new ResolveImageToImageTestCase(group->getTestContext(), getSampleCountCaseName(samples[samplesIndex]), description, params, COPY_MS_IMAGE_TO_MS_IMAGE));
	}
}